

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O2

RPCHelpMan * enumeratesigners(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  undefined1 auVar1 [32];
  long lVar2;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff988;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffff98c;
  undefined8 in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  undefined8 in_stack_fffffffffffff9a0;
  _Manager_type in_stack_fffffffffffff9a8;
  undefined8 in_stack_fffffffffffff9b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff9b8;
  pointer in_stack_fffffffffffff9c8;
  pointer pRVar4;
  pointer in_stack_fffffffffffff9d0;
  pointer pRVar5;
  pointer in_stack_fffffffffffff9d8;
  pointer pRVar6;
  undefined8 in_stack_fffffffffffff9e0;
  pointer pRVar7;
  pointer pRVar8;
  pointer pRVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffa00;
  pointer in_stack_fffffffffffffa10;
  RPCMethodImpl in_stack_fffffffffffffa18;
  allocator<char> local_5b2;
  allocator<char> local_5b1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_5b0;
  allocator<char> local_592;
  allocator<char> local_591;
  RPCResults local_590;
  vector<RPCArg,_std::allocator<RPCArg>_> local_578;
  allocator<char> local_55a;
  allocator<char> local_559;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  char *local_478;
  size_type local_470;
  char local_468 [8];
  undefined8 uStack_460;
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  RPCResult local_3d8 [2];
  string local_2c8 [32];
  string local_2a8 [32];
  RPCResult local_288;
  string local_200 [32];
  string local_1e0 [32];
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"enumeratesigners",&local_559);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"Returns a list of external signers from -signer.",&local_55a);
  local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_591);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_592);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"signers",&local_5b1);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"",&local_5b2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,"",(allocator<char> *)&stack0xfffffffffffffa2f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2c8,"",(allocator<char> *)&stack0xfffffffffffffa2e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f8,"fingerprint",(allocator<char> *)&stack0xfffffffffffffa0f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,"Master key fingerprint",(allocator<char> *)&stack0xfffffffffffffa0e);
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff98c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff988;
  m_key_name._M_string_length = in_stack_fffffffffffff990;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff998;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff9a0;
  description._M_string_length = in_stack_fffffffffffff9b0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9a8;
  description.field_2 = in_stack_fffffffffffff9b8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff9d0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff9c8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff9d8;
  RPCResult::RPCResult(local_3d8,STR_HEX,m_key_name,description,inner,SUB81(local_3f8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_438,"name",(allocator<char> *)&stack0xfffffffffffff9e7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,"Device name",(allocator<char> *)&stack0xfffffffffffff9e6);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff98c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff988;
  m_key_name_00._M_string_length = in_stack_fffffffffffff990;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff998;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff9a0;
  description_00._M_string_length = in_stack_fffffffffffff9b0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9a8;
  description_00.field_2._M_local_buf = in_stack_fffffffffffff9b8._M_local_buf;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(local_3d8 + 1,STR,m_key_name_00,description_00,inner_00,SUB81(local_438,0));
  __l._M_len = 2;
  __l._M_array = local_3d8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa10,__l,
             (allocator_type *)&stack0xfffffffffffff9c7);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff98c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff988;
  m_key_name_01._M_string_length = in_stack_fffffffffffff990;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff998;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff9a0;
  description_01._M_string_length = in_stack_fffffffffffff9b0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9a8;
  description_01.field_2._M_local_buf = in_stack_fffffffffffff9b8._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult(&local_288,OBJ,m_key_name_01,description_01,inner_01,SUB81(local_2a8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_288;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa30,__l_00,
             (allocator_type *)&stack0xfffffffffffff9c6);
  uVar3 = 0;
  auVar1._4_8_ = in_stack_fffffffffffff990;
  auVar1._0_4_ = in_stack_fffffffffffff98c;
  auVar1._12_8_ = in_stack_fffffffffffff998;
  auVar1._20_8_ = in_stack_fffffffffffff9a0;
  auVar1._28_4_ = 0;
  description_02._M_string_length = in_stack_fffffffffffff9b0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9a8;
  description_02.field_2._M_local_buf = in_stack_fffffffffffff9b8._M_local_buf;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult
            (&local_1c0,ARR,(string)(auVar1 << 0x20),SUB81(local_1e0,0),description_02,inner_02,
             false);
  __l_01._M_len = 1;
  __l_01._M_array = &local_1c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_5b0,__l_01,(allocator_type *)&stack0xfffffffffffff9c5);
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff98c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_02._M_string_length = in_stack_fffffffffffff990;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff998;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff9a0;
  description_03._M_string_length = in_stack_fffffffffffff9b0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9a8;
  description_03.field_2 = in_stack_fffffffffffff9b8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult(&local_f8,OBJ,m_key_name_02,description_03,inner_03,SUB81(local_118,0));
  result._4_4_ = in_stack_fffffffffffff98c;
  result.m_type = uVar3;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff990;
  result.m_key_name._M_string_length = in_stack_fffffffffffff998;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff9a0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff9a8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9b0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff9b8;
  result._64_8_ = pRVar4;
  result.m_description._M_dataplus._M_p = (pointer)pRVar5;
  result.m_description._M_string_length = (size_type)pRVar6;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff9e0;
  result.m_description.field_2._8_8_ = pRVar7;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar8;
  result.m_cond._M_string_length = (size_type)pRVar9;
  result.m_cond.field_2 = in_stack_fffffffffffffa00;
  RPCResults::RPCResults(&local_590,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"enumeratesigners",(allocator<char> *)&stack0xfffffffffffff9c4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"",(allocator<char> *)&stack0xfffffffffffff9c3);
  HelpExampleCli(&local_4b8,&local_4d8,&local_4f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"enumeratesigners",(allocator<char> *)&stack0xfffffffffffff9c2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"",(allocator<char> *)&stack0xfffffffffffff9c1);
  HelpExampleRpc(&local_518,&local_538,&local_558);
  std::operator+(&local_498,&local_4b8,&local_518);
  local_478 = local_468;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p == &local_498.field_2) {
    uStack_460 = local_498.field_2._8_8_;
  }
  else {
    local_478 = local_498._M_dataplus._M_p;
  }
  local_470 = local_498._M_string_length;
  local_498._M_string_length = 0;
  local_498.field_2._M_local_buf[0] = '\0';
  description_04._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/external_signer.cpp:43:9)>
       ::_M_invoke;
  description_04._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/external_signer.cpp:43:9)>
                ::_M_manager;
  description_04.field_2 = in_stack_fffffffffffff9b8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar4;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar6;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar7;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9e0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar8;
  examples.m_examples._8_16_ = in_stack_fffffffffffffa00;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar9;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffa10;
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff990,&stack0xfffffffffffff998)),
             description_04,args,results,examples,in_stack_fffffffffffffa18);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff998);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_590.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_5b0);
  RPCResult::~RPCResult(&local_1c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa30);
  RPCResult::~RPCResult(&local_288);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa10);
  lVar2 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_3d8[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff9c8);
  std::__cxx11::string::~string(local_458);
  std::__cxx11::string::~string(local_438);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff9e8);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::string::~string(local_3f8);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_578);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan enumeratesigners()
{
    return RPCHelpMan{"enumeratesigners",
        "Returns a list of external signers from -signer.",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::ARR, "signers", /*optional=*/false, "",
                {
                    {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "fingerprint", "Master key fingerprint"},
                        {RPCResult::Type::STR, "name", "Device name"},
                    }},
                },
                }
            }
        },
        RPCExamples{
            HelpExampleCli("enumeratesigners", "")
            + HelpExampleRpc("enumeratesigners", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const std::string command = gArgs.GetArg("-signer", "");
            if (command == "") throw JSONRPCError(RPC_MISC_ERROR, "Error: restart bitcoind with -signer=<cmd>");
            const std::string chain = gArgs.GetChainTypeString();
            UniValue signers_res = UniValue::VARR;
            try {
                std::vector<ExternalSigner> signers;
                ExternalSigner::Enumerate(command, signers, chain);
                for (const ExternalSigner& signer : signers) {
                    UniValue signer_res = UniValue::VOBJ;
                    signer_res.pushKV("fingerprint", signer.m_fingerprint);
                    signer_res.pushKV("name", signer.m_name);
                    signers_res.push_back(std::move(signer_res));
                }
            } catch (const std::exception& e) {
                throw JSONRPCError(RPC_MISC_ERROR, e.what());
            }
            UniValue result(UniValue::VOBJ);
            result.pushKV("signers", std::move(signers_res));
            return result;
        }
    };
}